

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ChainBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_40;
  int c;
  int fVeryVerbose;
  int fVerbose;
  int nConfMax;
  int nFrameMax;
  Vec_Ptr_t *vCexes;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _nConfMax = (Vec_Ptr_t *)0x0;
  fVerbose = 200;
  fVeryVerbose = 0;
  c = 0;
  local_40 = 0;
  vCexes = (Vec_Ptr_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)vCexes,"FCvwh");
      if (iVar1 == -1) {
        if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9ChainBmc(): There is no AIG.\n");
          return 0;
        }
        iVar1 = Gia_ManRegNum(pAStack_18->pGia);
        if (iVar1 == 0) {
          Abc_Print(-1,"Abc_CommandAbc9ChainBmc(): The AIG is combinational.\n");
          return 0;
        }
        Bmc_ChainTest(pAStack_18->pGia,fVerbose,fVeryVerbose,c,local_40,(Vec_Ptr_t **)&nConfMax);
        if (_nConfMax != (Vec_Ptr_t *)0x0) {
          Vec_PtrFreeFree(_nConfMax);
        }
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x46) {
        if (argv_local._4_4_ <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
          goto LAB_002bce2f;
        }
        fVerbose = atoi(*(char **)(&vCexes->nCap + (long)globalUtilOptind * 2));
        globalUtilOptind = globalUtilOptind + 1;
        if (fVerbose < 0) goto LAB_002bce2f;
      }
      else {
        if (iVar1 == 0x68) goto LAB_002bce2f;
        if (iVar1 == 0x76) {
          c = c ^ 1;
        }
        else {
          if (iVar1 != 0x77) goto LAB_002bce2f;
          local_40 = local_40 ^ 1;
        }
      }
    }
    if (argv_local._4_4_ <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    fVeryVerbose = atoi(*(char **)(&vCexes->nCap + (long)globalUtilOptind * 2));
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < fVeryVerbose);
LAB_002bce2f:
  Abc_Print(-2,"usage: &chainbmc [-FC <num>] [-vwh]\n");
  Abc_Print(-2,"\t           runs a specialized flavor of BMC\n");
  Abc_Print(-2,"\t-F <num> : the max number of timeframes (0 = unused) [default = %d]\n",
            (ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-C <num> : the max number of conflicts (0 = unused) [default = %d]\n",
            (ulong)(uint)fVeryVerbose);
  pcVar2 = "no";
  if (c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-w       : toggle printing even more information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ChainBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Bmc_ChainTest( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose, Vec_Ptr_t ** pvCexes );
    Vec_Ptr_t * vCexes = NULL;
    int nFrameMax    =  200;
    int nConfMax     =    0;
    int fVerbose     =    0;
    int fVeryVerbose =    0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrameMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ChainBmc(): There is no AIG.\n" );
        return 0;
    }
    if ( !Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ChainBmc(): The AIG is combinational.\n" );
        return 0;
    }
    Bmc_ChainTest( pAbc->pGia, nFrameMax, nConfMax, fVerbose, fVeryVerbose, &vCexes );
    if ( vCexes ) Vec_PtrFreeFree( vCexes );
    //pAbc->Status  = ...;
    //pAbc->nFrames = pPars->iFrame;
    //Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;
usage:
    Abc_Print( -2, "usage: &chainbmc [-FC <num>] [-vwh]\n" );
    Abc_Print( -2, "\t           runs a specialized flavor of BMC\n" );
    Abc_Print( -2, "\t-F <num> : the max number of timeframes (0 = unused) [default = %d]\n", nFrameMax );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts (0 = unused) [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing even more information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}